

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDAApolynomialGetY(IDAMem IDA_mem,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector *yyS,
                      N_Vector *ypS)

{
  IDAadjMemRec *pIVar1;
  IDAdtpntMemRec **ppIVar2;
  IDAdtpntMemRec *pIVar3;
  undefined8 *puVar4;
  sunrealtype *psVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int newpoint;
  ulong local_b8;
  ulong local_b0;
  IDAdtpntMemRec **local_a8;
  ulong uStack_a0;
  N_Vector *local_98;
  N_Vector *local_90;
  N_Vector local_88;
  sunrealtype local_80;
  double local_78;
  ulong uStack_70;
  ulong local_68;
  N_Vector local_60;
  ulong local_58;
  long index;
  double local_48;
  ulong uStack_40;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  uVar14 = 0;
  if ((yyS != (N_Vector *)0x0) && (uVar14 = 0, pIVar1->ia_interpSensi != 0)) {
    uVar14 = IDA_mem->ida_Ns;
  }
  ppIVar2 = pIVar1->dt_mem;
  local_98 = ypS;
  local_90 = yyS;
  local_88 = yp;
  local_80 = t;
  iVar6 = IDAAfindIndex(IDA_mem,t,&index,&newpoint);
  if (iVar6 != 0) {
    return iVar6;
  }
  local_a8 = ppIVar2;
  if (index == 0) {
    puVar4 = (undefined8 *)(*ppIVar2)->content;
    N_VScale(0x3ff0000000000000,*puVar4,yy);
    N_VScale(0x3ff0000000000000,puVar4[2],local_88);
    if ((int)uVar14 < 1) {
      return 0;
    }
    psVar5 = IDA_mem->ida_cvals;
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      psVar5[uVar12] = 1.0;
    }
    iVar6 = N_VScaleVectorArray(uVar14,IDA_mem->ida_cvals,puVar4[1],local_90);
    if (iVar6 != 0) {
      return -0x1c;
    }
    iVar6 = N_VScaleVectorArray(uVar14,IDA_mem->ida_cvals,puVar4[3],local_98);
    goto LAB_001184e0;
  }
  local_78 = ABS(ppIVar2[index]->t - ppIVar2[index + -1]->t);
  uStack_70 = 0;
  local_60 = yy;
  if (pIVar1->ia_tfinal <= pIVar1->ia_tinitial) {
    uVar8 = *(uint *)((long)ppIVar2[index + -1]->content + 0x20);
    uVar12 = (ulong)uVar8;
    local_b8 = (ulong)(int)uVar8;
    uVar7 = ~local_b8 + pIVar1->ia_np;
    if (pIVar1->ia_np - index <= (long)local_b8) {
      uVar7 = index - 1;
    }
    if (newpoint == 0) goto LAB_001181cf;
    if (pIVar1->ia_tinitial < pIVar1->ia_tfinal) goto LAB_001180d9;
    for (lVar10 = 0; lVar10 <= (long)local_b8; lVar10 = lVar10 + 1) {
      pIVar3 = ppIVar2[uVar7 + lVar10 + -1];
      pIVar1->ia_T[lVar10] = pIVar3->t;
      puVar4 = (undefined8 *)pIVar3->content;
      N_VScale(0x3ff0000000000000,*puVar4,pIVar1->ia_Y[lVar10]);
      if (0 < (int)uVar14) {
        psVar5 = IDA_mem->ida_cvals;
        for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
          psVar5[uVar9] = 1.0;
        }
        iVar6 = N_VScaleVectorArray(uVar14,IDA_mem->ida_cvals,puVar4[1]);
        if (iVar6 != 0) {
          return -0x1c;
        }
      }
    }
LAB_00118285:
    local_68 = 0;
    uVar7 = 0;
    if (0 < (int)uVar14) {
      uVar7 = (ulong)uVar14;
    }
    if (0 < (int)uVar12) {
      local_68 = uVar12 & 0xffffffff;
    }
    local_58 = (ulong)((int)local_68 + 1);
    local_b0 = uVar12;
    for (uVar9 = 1; uVar12 = local_b8, uVar9 != local_58; uVar9 = uVar9 + 1) {
      while (uVar11 = uVar12, (long)uVar9 <= (long)uVar11) {
        local_a8 = (IDAdtpntMemRec **)
                   (local_78 /
                   (pIVar1->ia_T[uVar11] - *(double *)((long)pIVar1 + (uVar11 - uVar9) * 8 + 0x128))
                   );
        local_48 = -(double)local_a8;
        uStack_40 = uStack_70 ^ 0x8000000000000000;
        uStack_a0 = uStack_70;
        N_VLinearSum(pIVar1->ia_Y[uVar11],pIVar1->ia_Y[uVar11 - 1],pIVar1->ia_Y[uVar11]);
        for (uVar13 = 0; uVar12 = uVar11 - 1, uVar7 != uVar13; uVar13 = uVar13 + 1) {
          N_VLinearSum(local_a8,local_48,pIVar1->ia_YS[uVar11][uVar13],
                       (&pIVar1->ia_Y[uVar11 + 5]->content)[uVar13],pIVar1->ia_YS[uVar11][uVar13]);
        }
      }
    }
    uVar12 = local_b0;
    uVar8 = (uint)local_68;
  }
  else {
    uVar12 = (ulong)*(int *)((long)ppIVar2[index]->content + 0x20);
    uVar7 = uVar12;
    if ((long)uVar12 < index) {
      uVar7 = index;
    }
    if (newpoint != 0) {
LAB_001180d9:
      local_b8 = (ulong)(int)uVar12;
      for (lVar10 = 0; lVar10 <= (long)local_b8; lVar10 = lVar10 + 1) {
        pIVar3 = local_a8[uVar7 - lVar10];
        pIVar1->ia_T[lVar10] = pIVar3->t;
        puVar4 = (undefined8 *)pIVar3->content;
        N_VScale(0x3ff0000000000000,*puVar4,pIVar1->ia_Y[lVar10]);
        if (0 < (int)uVar14) {
          psVar5 = IDA_mem->ida_cvals;
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            psVar5[uVar9] = 1.0;
          }
          iVar6 = N_VScaleVectorArray(uVar14,IDA_mem->ida_cvals,puVar4[1]);
          if (iVar6 != 0) {
            return -0x1c;
          }
        }
      }
      goto LAB_00118285;
    }
LAB_001181cf:
    uVar8 = 0;
    if (0 < (int)(uint)uVar12) {
      uVar8 = (uint)uVar12;
    }
  }
  psVar5 = IDA_mem->ida_cvals;
  *psVar5 = 1.0;
  dVar16 = 1.0;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    dVar16 = (dVar16 * (local_80 - pIVar1->ia_T[uVar7])) / local_78;
    psVar5[uVar7 + 1] = dVar16;
  }
  iVar15 = (int)uVar12 + 1;
  iVar6 = N_VLinearCombination(iVar15,psVar5,pIVar1->ia_Y,local_60);
  if (iVar6 != 0) {
    return -0x1c;
  }
  local_b0 = uVar12;
  if ((0 < (int)uVar14) &&
     (iVar6 = N_VLinearCombinationVectorArray
                        (uVar14,iVar15,IDA_mem->ida_cvals,pIVar1->ia_YS,local_90), iVar6 != 0)) {
    return -0x1c;
  }
  uVar12 = local_b0;
  dVar16 = 0.0;
  dVar17 = 1.0;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    dVar18 = (local_80 - pIVar1->ia_T[uVar7]) / local_78;
    dVar16 = dVar16 * dVar18 + dVar17 / local_78;
    dVar17 = dVar17 * dVar18;
    IDA_mem->ida_cvals[uVar7] = dVar16;
  }
  iVar6 = N_VLinearCombination(local_b0 & 0xffffffff,IDA_mem->ida_cvals,pIVar1->ia_Y + 1,local_88);
  if (iVar6 != 0) {
    return -0x1c;
  }
  if ((int)uVar14 < 1) {
    return 0;
  }
  iVar6 = N_VLinearCombinationVectorArray
                    (uVar14,uVar12 & 0xffffffff,IDA_mem->ida_cvals,pIVar1->ia_YS + 1,local_98);
LAB_001184e0:
  if (iVar6 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int IDAApolynomialGetY(IDAMem IDA_mem, sunrealtype t, N_Vector yy,
                              N_Vector yp, N_Vector* yyS, N_Vector* ypS)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int index, base;
  sunbooleantype newpoint;
  sunrealtype delt, factor, Psi, Psiprime;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Local value of Ns */
  NS = (IDAADJ_mem->ia_interpSensi && (yyS != NULL)) ? IDA_mem->ida_Ns : 0;

  /* Get the index in dt_mem */
  flag = IDAAfindIndex(IDA_mem, t, &index, &newpoint);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (index == 0)
  {
    content = (IDApolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, yy);
    N_VScale(ONE, content->yd, yp);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS, yyS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->ySd, ypS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
    }

    return (IDA_SUCCESS);
  }

  /* Scaling factor */
  delt = SUNRabs(dt_mem[index]->t - dt_mem[index - 1]->t);

  /* Find the direction of the forward integration */
  dir = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = index;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (index < order) { base += order - index; }
  }
  else
  {
    base    = index - 1;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (IDAADJ_mem->ia_np - index > order)
    {
      base -= index + order - IDAADJ_mem->ia_np;
    }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - j]->t;
        content             = (IDApolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - 1 + j]->t;
        content = (IDApolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = delt / (IDAADJ_mem->ia_T[j] - IDAADJ_mem->ia_T[j - i]);
        N_VLinearSum(factor, IDAADJ_mem->ia_Y[j], -factor,
                     IDAADJ_mem->ia_Y[j - 1], IDAADJ_mem->ia_Y[j]);

        for (is = 0; is < NS; is++)
        {
          N_VLinearSum(factor, IDAADJ_mem->ia_YS[j][is], -factor,
                       IDAADJ_mem->ia_YS[j - 1][is], IDAADJ_mem->ia_YS[j][is]);
        }
      }
    }
  }

  /* Perform the actual interpolation for yy using nested multiplications */

  IDA_mem->ida_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    IDA_mem->ida_cvals[i + 1] = IDA_mem->ida_cvals[i] *
                                (t - IDAADJ_mem->ia_T[i]) / delt;
  }

  retval = N_VLinearCombination(order + 1, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y,
                                yy);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS, yyS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  /* Perform the actual interpolation for yp.

     Writing p(t) = y0 + (t-t0)*f[t0,t1] + ... + (t-t0)(t-t1)...(t-tn)*f[t0,t1,...tn],
     denote psi_k(t) = (t-t0)(t-t1)...(t-tk).

     The formula used for p'(t) is:
       - p'(t) = f[t0,t1] + psi_1'(t)*f[t0,t1,t2] + ... + psi_n'(t)*f[t0,t1,...,tn]

     We recursively compute psi_k'(t) from:
       - psi_k'(t) = (t-tk)*psi_{k-1}'(t) + psi_{k-1}

     psi_k is rescaled with 1/delt each time is computed, because the Newton DDs from Y were
     scaled with delt.
  */

  Psi      = ONE;
  Psiprime = ZERO;

  for (i = 1; i <= order; i++)
  {
    factor = (t - IDAADJ_mem->ia_T[i - 1]) / delt;

    Psiprime = Psi / delt + factor * Psiprime;
    Psi      = Psi * factor;

    IDA_mem->ida_cvals[i - 1] = Psiprime;
  }

  retval = N_VLinearCombination(order, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS + 1, ypS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  return (IDA_SUCCESS);
}